

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void capnp::_::anon_unknown_18::fromException
               (Exception *exception,Builder builder,
               Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_&> *traceEncoder)

{
  bool bVar1;
  Type TVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  Detail *pDVar5;
  char *in_RCX;
  int *in_R8;
  ArrayPtr<const_kj::Exception::Detail> AVar6;
  Range<unsigned_long> RVar7;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  byte local_285;
  bool local_1f9;
  undefined1 local_1f8 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_1e8;
  String local_1d8;
  ArrayPtr<const_char> local_1c0;
  Function<kj::String_(const_kj::Exception_&)> *local_1b0;
  Function<kj::String_(const_kj::Exception_&)> *t;
  Function<kj::String_(const_kj::Exception_&)> *_t172;
  undefined1 local_190 [8];
  Builder out;
  unsigned_long i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  Builder detailsBuilder;
  ArrayPtr<const_kj::Exception::Detail> details;
  StringPtr local_f0;
  String local_e0;
  undefined1 local_c1 [25];
  undefined1 local_a8 [8];
  String scratch;
  String local_88;
  Context *local_70;
  Context *c;
  Context *_c146;
  undefined1 local_50 [8];
  Maybe<const_kj::Exception::Context_&> context;
  Vector<kj::String> contextLines;
  StringPtr description;
  Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_&> *traceEncoder_local;
  Exception *exception_local;
  
  join_0x00000010_0x00000000_ = (ArrayPtr<const_char>)kj::Exception::getDescription(exception);
  kj::Vector<kj::String>::Vector((Vector<kj::String> *)&context);
  kj::Exception::getContext((Exception *)local_50);
  while (c = kj::_::readMaybe<kj::Exception::Context_const>
                       ((Maybe<const_kj::Exception::Context_&> *)local_50), c != (Context *)0x0) {
    in_R8 = &c->line;
    in_RCX = ": ";
    local_70 = c;
    kj::
    str<char_const(&)[10],char_const*const&,char_const(&)[3],int_const&,char_const(&)[3],kj::String_const&>
              (&local_88,(kj *)0xa8065f,(char (*) [10])c,(char **)0xa6d8d9,(char (*) [3])in_R8,
               (int *)0xa6d8d9,(char (*) [3])&c->description,
               (String *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    kj::Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&context,&local_88);
    kj::String::~String(&local_88);
    kj::Maybe::operator_cast_to_Type((Maybe *)&scratch.content.disposer);
    kj::Maybe<const_kj::Exception::Context_&>::operator=
              ((Maybe<const_kj::Exception::Context_&> *)local_50,
               (Maybe<const_kj::Exception::Context_&> *)&scratch.content.disposer);
  }
  kj::String::String((String *)local_a8);
  sVar3 = kj::Vector<kj::String>::size((Vector<kj::String> *)&context);
  if (sVar3 != 0) {
    local_c1[0] = 10;
    kj::strArray<kj::Vector<kj::String>&>
              (&local_e0,(kj *)&context,(Vector<kj::String> *)0xa6d9de,in_RCX);
    kj::str<kj::StringPtr&,char,kj::String>
              ((String *)(local_c1 + 1),(kj *)&contextLines.builder.disposer,(StringPtr *)local_c1,
               (char *)&local_e0,(String *)in_R8);
    kj::String::operator=((String *)local_a8,(String *)(local_c1 + 1));
    kj::String::~String((String *)(local_c1 + 1));
    kj::String::~String(&local_e0);
    kj::StringPtr::StringPtr(&local_f0,(String *)local_a8);
    description.content.ptr = (char *)local_f0.content.size_;
    contextLines.builder.disposer = (ArrayDisposer *)local_f0.content.ptr;
  }
  Text::Reader::Reader((Reader *)&details.size_,(StringPtr *)&contextLines.builder.disposer);
  rpc::Exception::Builder::setReason(&builder,(Reader)stack0xffffffffffffff00);
  TVar2 = kj::Exception::getType(exception);
  rpc::Exception::Builder::setType(&builder,(Type)TVar2);
  AVar6 = kj::Exception::getDetails(exception);
  details.ptr = (Detail *)AVar6.size_;
  detailsBuilder.builder._32_8_ = AVar6.ptr;
  sVar3 = kj::ArrayPtr<const_kj::Exception::Detail>::size
                    ((ArrayPtr<const_kj::Exception::Detail> *)&detailsBuilder.builder.structDataSize
                    );
  if (sVar3 != 0) {
    sVar3 = kj::ArrayPtr<const_kj::Exception::Detail>::size
                      ((ArrayPtr<const_kj::Exception::Detail> *)
                       &detailsBuilder.builder.structDataSize);
    rpc::Exception::Builder::initDetails((Builder *)&__range3,&builder,(uint)sVar3);
    RVar7 = kj::indices<kj::ArrayPtr<kj::Exception::Detail_const>&>
                      ((ArrayPtr<const_kj::Exception::Detail> *)
                       &detailsBuilder.builder.structDataSize);
    __begin3.value = RVar7.begin_;
    __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end3,(Iterator *)&i),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      puVar4 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
      out._builder._32_8_ = *puVar4;
      List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Builder::operator[]
                ((Builder *)local_190,(Builder *)&__range3,out._builder.dataSize);
      pDVar5 = kj::ArrayPtr<const_kj::Exception::Detail>::operator[]
                         ((ArrayPtr<const_kj::Exception::Detail> *)
                          &detailsBuilder.builder.structDataSize,out._builder._32_8_);
      rpc::Exception::Detail::Builder::setDetailId((Builder *)local_190,pDVar5->id);
      pDVar5 = kj::ArrayPtr<const_kj::Exception::Detail>::operator[]
                         ((ArrayPtr<const_kj::Exception::Detail> *)
                          &detailsBuilder.builder.structDataSize,out._builder._32_8_);
      Data::Reader::Reader((Reader *)&_t172,&pDVar5->value);
      rpc::Exception::Detail::Builder::setData((Builder *)local_190,(Reader_conflict)__t172);
      kj::Range<unsigned_long>::Iterator::operator++(&__end3);
    }
  }
  t = kj::_::readMaybe<kj::Function<kj::String(kj::Exception_const&)>>(traceEncoder);
  if (t != (Function<kj::String_(const_kj::Exception_&)> *)0x0) {
    local_1b0 = t;
    kj::Function<kj::String_(const_kj::Exception_&)>::operator()(&local_1d8,t,exception);
    Text::Reader::Reader((Reader *)&local_1c0,&local_1d8);
    rpc::Exception::Builder::setTrace(&builder,(Reader)local_1c0);
    kj::String::~String(&local_1d8);
  }
  TVar2 = kj::Exception::getType(exception);
  local_285 = 0;
  if (TVar2 == FAILED) {
    local_1e8 = (ArrayPtr<const_char>)kj::Exception::getDescription(exception);
    kj::StringPtr::StringPtr((StringPtr *)local_1f8,"remote exception:");
    bVar1 = kj::StringPtr::startsWith((StringPtr *)&local_1e8,(StringPtr *)local_1f8);
    local_285 = bVar1 ^ 0xff;
  }
  if ((local_285 & 1) != 0) {
    local_1f9 = kj::_::Debug::shouldLog(INFO);
    while (local_1f9 != false) {
      kj::_::Debug::log<char_const(&)[27],kj::Exception_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xb2,INFO,"\"returning failure over rpc\", exception",
                 (char (*) [27])"returning failure over rpc",exception);
      local_1f9 = false;
    }
  }
  kj::String::~String((String *)local_a8);
  kj::Vector<kj::String>::~Vector((Vector<kj::String> *)&context);
  return;
}

Assistant:

void fromException(const kj::Exception& exception, rpc::Exception::Builder builder,
                   kj::Maybe<kj::Function<kj::String(const kj::Exception&)>&> traceEncoder) {
  kj::StringPtr description = exception.getDescription();

  // Include context, if any.
  kj::Vector<kj::String> contextLines;
  for (auto context = exception.getContext();;) {
    KJ_IF_SOME(c, context) {
      contextLines.add(kj::str("context: ", c.file, ": ", c.line, ": ", c.description));
      context = c.next;
    } else {
      break;
    }
  }